

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void av1_make_default_subpel_ms_params
               (SUBPEL_MOTION_SEARCH_PARAMS *ms_params,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,
               MV *ref_mv,int *cost_list)

{
  short sVar1;
  short sVar2;
  int iVar3;
  MvCosts *pMVar4;
  int32_t *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  ms_params->allow_hp = (uint)(cpi->common).features.allow_high_precision_mv;
  ms_params->forced_stop = (cpi->sf).mv_sf.subpel_force_stop;
  ms_params->iters_per_step = (cpi->sf).mv_sf.subpel_iters_per_step;
  if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
    cost_list = (int *)0x0;
  }
  else if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
    cost_list = (int *)0x0;
  }
  ms_params->cost_list = cost_list;
  sVar1 = ref_mv->row;
  iVar10 = (int)sVar1;
  sVar2 = ref_mv->col;
  iVar14 = (int)sVar2;
  iVar12 = (x->mv_limits).col_min * 8;
  if (iVar12 <= iVar14 + -0x1ff8) {
    iVar12 = iVar14 + -0x1ff8;
  }
  iVar11 = (x->mv_limits).col_max * 8;
  if (iVar14 + 0x1ff8 <= iVar11) {
    iVar11 = iVar14 + 0x1ff8;
  }
  iVar6 = (x->mv_limits).row_min * 8;
  iVar13 = iVar10 + -0x1ff8;
  if (iVar10 + -0x1ff8 < iVar6) {
    iVar13 = iVar6;
  }
  iVar7 = (x->mv_limits).row_max * 8;
  iVar6 = iVar10 + 0x1ff8;
  if (iVar7 < iVar10 + 0x1ff8) {
    iVar6 = iVar7;
  }
  if (iVar11 < iVar12) {
    iVar11 = iVar12;
  }
  if (iVar6 < iVar13) {
    iVar6 = iVar13;
  }
  if (iVar12 < -0x3ffe) {
    iVar12 = -0x3fff;
  }
  (ms_params->mv_limits).col_min = iVar12;
  if (0x3ffe < iVar11) {
    iVar11 = 0x3fff;
  }
  (ms_params->mv_limits).col_max = iVar11;
  if (iVar13 < -0x3ffe) {
    iVar13 = -0x3fff;
  }
  (ms_params->mv_limits).row_min = iVar13;
  if (0x3ffe < iVar6) {
    iVar6 = 0x3fff;
  }
  (ms_params->mv_limits).row_max = iVar6;
  if ((cpi->oxcf).algo_cfg.sharpness == 3) {
    iVar7 = (x->e_mbd).mi_row;
    iVar3 = (x->e_mbd).mi_col;
    iVar9 = (cpi->common).height * 8 +
            ((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bsize] + iVar7) * -0x20 + 0x40;
    iVar8 = (cpi->common).width * 8 +
            ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bsize] + iVar3) * -0x20 + 0x40;
    iVar7 = iVar7 * -0x20 + -0x40;
    if (iVar7 < iVar13) {
      iVar7 = iVar13;
    }
    (ms_params->mv_limits).row_min = iVar7;
    if (iVar6 < iVar9) {
      iVar9 = iVar6;
    }
    (ms_params->mv_limits).row_max = iVar9;
    iVar13 = iVar3 * -0x20 + -0x40;
    if (iVar13 < iVar12) {
      iVar13 = iVar12;
    }
    (ms_params->mv_limits).col_min = iVar13;
    if (iVar11 < iVar8) {
      iVar8 = iVar11;
    }
    (ms_params->mv_limits).col_max = iVar8;
  }
  pMVar4 = x->mv_costs;
  (ms_params->mv_cost_params).ref_mv = ref_mv;
  (ms_params->mv_cost_params).mv_cost_type = '\0';
  iVar12 = x->errorperbit;
  iVar11 = x->sadperbit;
  (ms_params->mv_cost_params).full_ref_mv =
       (FULLPEL_MV)
       ((uint)(-1 < sVar1) + iVar10 + 3 >> 3 & 0xffff |
       ((uint)(-1 < sVar2) + iVar14) * 0x2000 + 0x6000 & 0xffff0000);
  (ms_params->mv_cost_params).error_per_bit = iVar12;
  (ms_params->mv_cost_params).sad_per_bit = iVar11;
  if (pMVar4 != (MvCosts *)0x0) {
    (ms_params->mv_cost_params).mvjcost = pMVar4->nmv_joint_cost;
    (ms_params->mv_cost_params).mvcost[0] = *pMVar4->mv_cost_stack;
    (ms_params->mv_cost_params).mvcost[1] = pMVar4->mv_cost_stack[1];
  }
  (ms_params->var_params).vfp = cpi->ppi->fn_ptr + bsize;
  (ms_params->var_params).subpel_search_type = (cpi->sf).mv_sf.use_accurate_subpel_search;
  (ms_params->var_params).w = (uint)block_size_wide[bsize];
  (ms_params->var_params).h = (uint)block_size_high[bsize];
  (ms_params->var_params).ms_buffers.ref = (x->e_mbd).plane[0].pre;
  (ms_params->var_params).ms_buffers.src = &x->plane[0].src;
  (ms_params->var_params).ms_buffers.second_pred = (uint8_t *)0x0;
  (ms_params->var_params).ms_buffers.mask = (uint8_t *)0x0;
  (ms_params->var_params).ms_buffers.mask_stride = 0;
  (ms_params->var_params).ms_buffers.inv_mask = 0;
  piVar5 = (x->obmc_buffer).mask;
  (ms_params->var_params).ms_buffers.wsrc = (x->obmc_buffer).wsrc;
  (ms_params->var_params).ms_buffers.obmc_mask = piVar5;
  return;
}

Assistant:

void av1_make_default_subpel_ms_params(SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                       const struct AV1_COMP *cpi,
                                       const MACROBLOCK *x, BLOCK_SIZE bsize,
                                       const MV *ref_mv, const int *cost_list) {
  const AV1_COMMON *cm = &cpi->common;
  // High level params
  ms_params->allow_hp = cm->features.allow_high_precision_mv;
  ms_params->forced_stop = cpi->sf.mv_sf.subpel_force_stop;
  ms_params->iters_per_step = cpi->sf.mv_sf.subpel_iters_per_step;
  ms_params->cost_list = cond_cost_list_const(cpi, cost_list);

  av1_set_subpel_mv_search_range(&ms_params->mv_limits, &x->mv_limits, ref_mv);

  if (cpi->oxcf.algo_cfg.sharpness == 3) {
    int top_margin = GET_MV_SUBPEL(x->e_mbd.mi_row * MI_SIZE + 8);
    int left_margin = GET_MV_SUBPEL(x->e_mbd.mi_col * MI_SIZE + 8);
    int bottom_margin =
        GET_MV_SUBPEL(cpi->common.height - mi_size_high[bsize] * MI_SIZE -
                      x->e_mbd.mi_row * MI_SIZE + 8);
    int right_margin =
        GET_MV_SUBPEL(cpi->common.width - mi_size_wide[bsize] * MI_SIZE -
                      x->e_mbd.mi_col * MI_SIZE + 8);
    SubpelMvLimits *mv_limits = &ms_params->mv_limits;
    mv_limits->row_min = AOMMAX(mv_limits->row_min, -top_margin);
    mv_limits->row_max = AOMMIN(mv_limits->row_max, bottom_margin);
    mv_limits->col_min = AOMMAX(mv_limits->col_min, -left_margin);
    mv_limits->col_max = AOMMIN(mv_limits->col_max, right_margin);
  }

  // Mvcost params
  init_mv_cost_params(&ms_params->mv_cost_params, x->mv_costs, ref_mv,
                      x->errorperbit, x->sadperbit);

  // Subpel variance params
  ms_params->var_params.vfp = &cpi->ppi->fn_ptr[bsize];
  ms_params->var_params.subpel_search_type =
      cpi->sf.mv_sf.use_accurate_subpel_search;
  ms_params->var_params.w = block_size_wide[bsize];
  ms_params->var_params.h = block_size_high[bsize];

  // Ref and src buffers
  MSBuffers *ms_buffers = &ms_params->var_params.ms_buffers;
  init_ms_buffers(ms_buffers, x);
}